

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintFunctionMap.cpp
# Opt level: O1

void __thiscall wasm::PrintFunctionMap::run(PrintFunctionMap *this,Module *module)

{
  pointer puVar1;
  Function *pFVar2;
  long *plVar3;
  long *plVar4;
  ostream *poVar5;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar6;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import_1;
  long *plVar7;
  undefined1 local_388 [8];
  Output output;
  string outFile;
  string local_50;
  
  local_388 = (undefined1  [8])&output.field_0x8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"symbolmap","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  Pass::getArgumentOrDefault
            ((string *)&output.field_0x308,&this->super_Pass,(string *)local_388,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_388 != (undefined1  [8])&output.field_0x8) {
    operator_delete((void *)local_388,output._8_8_ + 1);
  }
  Output::Output((Output *)local_388,(string *)&output.field_0x308,Text);
  puVar6 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  outFile.field_2._8_8_ = module;
  if (puVar6 != puVar1) {
    do {
      pFVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar2->super_Importable).module + 8) != (char *)0x0) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&output.field_0x1f8);
        local_50._M_dataplus._M_p._0_1_ = 0x3a;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_50,1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,*(char **)((long)&(pFVar2->super_Importable).super_Named + 8),
                            *(long *)&(pFVar2->super_Importable).super_Named);
        local_50._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_50,1);
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  plVar7 = *(long **)(outFile.field_2._8_8_ + 0x18);
  plVar3 = *(long **)(outFile.field_2._8_8_ + 0x20);
  if (plVar7 != plVar3) {
    do {
      plVar4 = (long *)*plVar7;
      if (plVar4[4] == 0) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&output.field_0x1f8);
        local_50._M_dataplus._M_p._0_1_ = 0x3a;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_50,1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)plVar4[1],*plVar4);
        local_50._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_50,1);
      }
      plVar7 = plVar7 + 1;
    } while (plVar7 != plVar3);
  }
  Output::~Output((Output *)local_388);
  if ((size_type *)output._776_8_ != &outFile._M_string_length) {
    operator_delete((void *)output._776_8_,outFile._M_string_length + 1);
  }
  return;
}

Assistant:

void run(Module* module) override {
    // If an argument is provided, write to that file; otherwise write to
    // stdout.
    auto outFile = getArgumentOrDefault("symbolmap", "");
    Output output(outFile, Flags::Text);
    auto& o = output.getStream();
    Index i = 0;
    auto write = [&](Function* func) {
      o << i++ << ':' << func->name.str << '\n';
    };
    ModuleUtils::iterImportedFunctions(*module, write);
    ModuleUtils::iterDefinedFunctions(*module, write);
  }